

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExternref(WastParser *this,Const *const_)

{
  char *s;
  TokenType TVar1;
  Result RVar2;
  Literal *pLVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  allocator<char> local_d1;
  size_t local_d0;
  uint64_t ref_bits;
  char *pcStack_c0;
  anon_union_16_2_ecfd7102_for_Location_1 local_b8;
  undefined1 local_a8 [32];
  Token token;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  Consume(&token,this);
  if ((this->options_->features).reference_types_enabled_ == false) {
    Error(this,0x176533);
  }
  else {
    GetLocation((Location *)&ref_bits,this);
    (const_->loc).field_1.field_1.offset = (size_t)local_b8.field_1.offset;
    *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_b8._8_8_;
    (const_->loc).filename._M_len = ref_bits;
    (const_->loc).filename._M_str = pcStack_c0;
    TVar1 = Peek(this,0);
    if ((TVar1 & ~After) != Int) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ref_bits,"a numeric literal",&local_d1);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (string *)&ref_bits,local_a8);
      RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_48,"123");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      std::__cxx11::string::_M_dispose();
      return (Result)RVar2.enum_;
    }
    Consume((Token *)&ref_bits,this);
    pLVar3 = Token::literal((Token *)&ref_bits);
    local_d0 = (pLVar3->text)._M_len;
    s = (pLVar3->text)._M_str;
    RVar2 = ParseInt64(s,s + local_d0,&ref_bits,UnsignedOnly);
    Const::set_externref(const_,ref_bits);
    if (RVar2.enum_ != Error) {
      return (Result)Ok;
    }
    Error(this,const_->loc,"invalid literal \"%.*s\"",local_d0,s,in_R8,in_R9);
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseExternref(Const* const_) {
  WABT_TRACE(ParseExternref);
  Token token = Consume();
  if (!options_->features.reference_types_enabled()) {
    Error(token.loc, "externref not allowed");
    return Result::Error;
  }

  Literal literal;
  std::string_view sv;
  const_->loc = GetLocation();
  TokenType token_type = Peek();

  switch (token_type) {
    case TokenType::Nat:
    case TokenType::Int: {
      literal = Consume().literal();
      sv = literal.text;
      break;
    }
    default:
      return ErrorExpected({"a numeric literal"}, "123");
  }

  uint64_t ref_bits;
  Result result = ParseInt64(sv, &ref_bits, ParseIntType::UnsignedOnly);

  const_->set_externref(static_cast<uintptr_t>(ref_bits));

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}